

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O3

void __thiscall
MyClientConnection::OnData(MyClientConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  ostringstream *poVar1;
  byte bVar2;
  uint32_t uVar3;
  uint3 uVar4;
  bool bVar5;
  OutputWorker *pOVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  undefined1 local_1b8 [392];
  
  if (bytes == 0) {
    return;
  }
  if (channel == 0x37) {
    return;
  }
  if (channel == 0x9b) {
    return;
  }
  bVar2 = *data;
  switch(bVar2) {
  case 3:
    if (2 < (int)Logger.ChannelMinLevel) {
      return;
    }
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger.ChannelName;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Server reported new connection: ID = ",0x25);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    pOVar6 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
    break;
  case 4:
    if (2 < (int)Logger.ChannelMinLevel) {
      return;
    }
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger.ChannelName;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Server reported removed connection: ID = ",0x29);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    pOVar6 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
    break;
  case 5:
    if (2 < (int)Logger.ChannelMinLevel) {
      return;
    }
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger.ChannelName;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Server rebroadcast from ID = ",0x1d);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": `",3);
    std::operator<<((ostream *)poVar1,(char *)(data + 4));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"`",1);
    pOVar6 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
    break;
  case 6:
    if ((int)Logger.ChannelMinLevel < 2) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Debug;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Got pre-connect data test",0x19);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    bVar5 = test::ValidatePreconnectData(channel,data,bytes);
    if (bVar5) {
      return;
    }
    if (4 < (int)Logger.ChannelMinLevel) {
      return;
    }
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger.ChannelName;
    local_1b8._8_4_ = Error;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"ERROR: Preconnect data was invalid!",0x23);
    pOVar6 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
    break;
  case 7:
    if ((int)Logger.ChannelMinLevel < 5 && channel != 0x98) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Corrupted data: Wrong channel",0x1d);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    if ((int)Logger.ChannelMinLevel < 5 && bytes != 0x578) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Corrupted data: Wrong size",0x1a);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    if ((int)Logger.ChannelMinLevel < 5 && *(int3 *)(data + 6) != -0x522ed3) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Corrupted data: Bad magic",0x19);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    uVar3 = *(uint32_t *)(data + 9);
    if ((this->NextPacketIndex != uVar3) && ((int)Logger.ChannelMinLevel < 5)) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Corrupted data: Incorrect packet id",0x23);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    this->NextPacketIndex = uVar3 + 1;
    return;
  case 8:
    if ((int)Logger.ChannelMinLevel < 5 && channel != 0x98) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Corrupted data: Wrong channel",0x1d);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    if ((bytes != 0x578) && ((int)Logger.ChannelMinLevel < 5)) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Corrupted data: Wrong size",0x1a);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    uVar4 = *(uint3 *)(data + 3);
    uVar7 = tonk::SDKConnection::FromLocalTime16(&this->super_SDKConnection,*(uint16_t *)(data + 1))
    ;
    uVar8 = tonk::SDKConnection::FromLocalTime23(&this->super_SDKConnection,(uint)uVar4);
    if ((int)Logger.ChannelMinLevel < 5 && *(int3 *)(data + 6) != -0x522ed3) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Corrupted data: Bad magic",0x19);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    uVar3 = *(uint32_t *)(data + 9);
    if ((this->NextPacketIndex != uVar3) && ((int)Logger.ChannelMinLevel < 5)) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Corrupted data: Incorrect packet id",0x23);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    this->NextPacketIndex = uVar3 + 1;
    tonk::SDKConnection::GetStatus((TonkStatus *)local_1b8,&this->super_SDKConnection);
    if ((local_1b8._0_8_ & 1) == 0) {
      return;
    }
    uVar9 = tonk_time();
    test::OWDTimeStatistics::AddSample(&this->OWDStats,uVar9 - uVar8);
    if (uVar9 - this->LastStatsUsec < 1000000) {
      return;
    }
    this->LastStatsUsec = uVar9;
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"DATA RESULT: Transmission time (acc=16) = ",0x2a);
      std::ostream::operator<<((ostream *)poVar1,(int)uVar9 - (int)uVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", (acc=23) = ",0xd);
      std::ostream::operator<<((ostream *)poVar1,(int)(uVar9 - uVar8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," # ",3);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    test::OWDTimeStatistics::PrintStatistics(&this->OWDStats);
    return;
  default:
    if (bVar2 == 200) {
      return;
    }
    if (4 < (int)Logger.ChannelMinLevel) {
      return;
    }
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger.ChannelName;
    local_1b8._8_4_ = Error;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"MyServerConnection: Got ",0x18);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," bytes of message data unexpected type ",0x27);
    std::ostream::operator<<((ostream *)poVar1,(uint)bVar2);
    pOVar6 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  return;
}

Assistant:

void MyClientConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (channel == TonkChannel_LowPri0 + 5 ||
        channel == TonkChannel_Reliable0 + 5)
    {
        // Ignore some test data
        return;
    }

    if (bytes <= 0) {
        return;
    }

    if (data[0] == 200)
    {
        static uint8_t expected = 0;
        ++expected;
        if (data[1] != expected)
        {
            //Logger.Info("UNORDERED: ", (int)data[1]);
            expected = data[1];
        }
        return;
    }

    if (data[0] == ID_LowPriBulkData_NoTimestamp)
    {
        TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
        if (channel != kLowPriBulkData_Channel) {
            Logger.Error("Corrupted data: Wrong channel");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
        if (bytes != kLowPriBulkData_Bytes) {
            Logger.Error("Corrupted data: Wrong size");
        }
        uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
        if (magic != kLowPriBulkMagic) {
            Logger.Error("Corrupted data: Bad magic");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
        uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
        TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
        if (NextPacketIndex != packetIndex) {
            Logger.Error("Corrupted data: Incorrect packet id");
        }
        NextPacketIndex = packetIndex + 1;
        for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
            TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
        }

        return;
    }

    if (data[0] == ID_LowPriBulkData_HasTimestamp)
    {
        TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
        if (channel != kLowPriBulkData_Channel) {
            Logger.Error("Corrupted data: Wrong channel");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
        if (bytes != kLowPriBulkData_Bytes) {
            Logger.Error("Corrupted data: Wrong size");
        }
        uint16_t ts16 = tonk::ReadU16_LE(data + 1);
        uint32_t ts23 = tonk::ReadU24_LE(data + 1 + 2);
        uint64_t lo16 = FromLocalTime16(ts16);
        uint64_t lo23 = FromLocalTime23(ts23);
        uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
        if (magic != kLowPriBulkMagic) {
            Logger.Error("Corrupted data: Bad magic");
        }
        TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
        uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
        TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
        if (NextPacketIndex != packetIndex) {
            Logger.Error("Corrupted data: Incorrect packet id");
        }
        NextPacketIndex = packetIndex + 1;
        for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
            TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
        }

        if (0 != (GetStatus().Flags & TonkFlag_TimeSync))
        {
            uint64_t nowUsec = tonk_time();
            uint64_t owdUsec = nowUsec - lo23;
            OWDStats.AddSample(owdUsec);

            if (nowUsec - LastStatsUsec >= 1000000)
            {
                LastStatsUsec = nowUsec;
#ifdef ENABLE_P2P_DATA_RESULT
                Logger.Info("DATA RESULT: Transmission time (acc=16) = ", (int)(nowUsec - lo16), ", (acc=23) = ", (int)(nowUsec - lo23), " # ", packetIndex);
                OWDStats.PrintStatistics();
#endif
            }
        }

        return;
    }
    if (data[0] == ID_ConnectionAdded)
    {
        const uint32_t id = tonk::ReadU32_LE(data + 1);
        Logger.Info("Server reported new connection: ID = ", id);
        return;
    }
    if (data[0] == ID_ConnectionRemoved)
    {
        const uint32_t id = tonk::ReadU32_LE(data + 1);
        Logger.Info("Server reported removed connection: ID = ", id);
        return;
    }
    if (data[0] == ID_ConnectionRebroadcast)
    {
        const uint32_t id = tonk::ReadU24_LE(data + 1);
        const char* msgStart = (char*)data + 1 + 3;

        Logger.Info("Server rebroadcast from ID = ", id, ": `", msgStart, "`");
        return;
    }
    if (data[0] == ID_PreConnectDataTest)
    {
        Logger.Debug("Got pre-connect data test");

        const bool validated = ValidatePreconnectData(channel, data, bytes);

        if (!validated) {
            Logger.Error("ERROR: Preconnect data was invalid!");
            TONK_CPP_SDK_DEBUG_BREAK();
        }
        return;
    }

    Logger.Error("MyServerConnection: Got ", bytes, " bytes of message data unexpected type ", (int)data[0]);
    TONK_CPP_SDK_DEBUG_BREAK();
}